

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::ConfigDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ConfigDeclarationSyntax *this,size_t index)

{
  __index_type _Var1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    pSVar2 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    goto LAB_002fc9f1;
  case 1:
    uVar3._0_2_ = (this->config).kind;
    uVar3._2_1_ = (this->config).field_0x2;
    uVar3._3_1_ = (this->config).numFlags;
    uVar4 = (this->config).rawLen;
    uVar5 = *(undefined4 *)&(this->config).info;
    uVar6 = *(undefined4 *)((long)&(this->config).info + 4);
    break;
  case 2:
    uVar3._0_2_ = (this->name).kind;
    uVar3._2_1_ = (this->name).field_0x2;
    uVar3._3_1_ = (this->name).numFlags;
    uVar4 = (this->name).rawLen;
    uVar5 = *(undefined4 *)&(this->name).info;
    uVar6 = *(undefined4 *)((long)&(this->name).info + 4);
    break;
  case 3:
    uVar3._0_2_ = (this->semi1).kind;
    uVar3._2_1_ = (this->semi1).field_0x2;
    uVar3._3_1_ = (this->semi1).numFlags;
    uVar4 = (this->semi1).rawLen;
    uVar5 = *(undefined4 *)&(this->semi1).info;
    uVar6 = *(undefined4 *)((long)&(this->semi1).info + 4);
    break;
  case 4:
    pSVar2 = &(this->localparams).super_SyntaxListBase.super_SyntaxNode;
    goto LAB_002fc9f1;
  case 5:
    uVar3._0_2_ = (this->design).kind;
    uVar3._2_1_ = (this->design).field_0x2;
    uVar3._3_1_ = (this->design).numFlags;
    uVar4 = (this->design).rawLen;
    uVar5 = *(undefined4 *)&(this->design).info;
    uVar6 = *(undefined4 *)((long)&(this->design).info + 4);
    break;
  case 6:
    pSVar2 = &(this->topCells).super_SyntaxListBase.super_SyntaxNode;
    goto LAB_002fc9f1;
  case 7:
    uVar3._0_2_ = (this->semi2).kind;
    uVar3._2_1_ = (this->semi2).field_0x2;
    uVar3._3_1_ = (this->semi2).numFlags;
    uVar4 = (this->semi2).rawLen;
    uVar5 = *(undefined4 *)&(this->semi2).info;
    uVar6 = *(undefined4 *)((long)&(this->semi2).info + 4);
    break;
  case 8:
    pSVar2 = &(this->rules).super_SyntaxListBase.super_SyntaxNode;
LAB_002fc9f1:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pSVar2;
LAB_002fc9f4:
    _Var1 = '\x01';
    goto LAB_002fc9f6;
  case 9:
    uVar3._0_2_ = (this->endconfig).kind;
    uVar3._2_1_ = (this->endconfig).field_0x2;
    uVar3._3_1_ = (this->endconfig).numFlags;
    uVar4 = (this->endconfig).rawLen;
    uVar5 = *(undefined4 *)&(this->endconfig).info;
    uVar6 = *(undefined4 *)((long)&(this->endconfig).info + 4);
    break;
  case 10:
    *(NamedBlockClauseSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         this->blockName;
    goto LAB_002fc9f4;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_002fc9d1;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar6;
LAB_002fc9d1:
  _Var1 = '\0';
LAB_002fc9f6:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ConfigDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return config;
        case 2: return name;
        case 3: return semi1;
        case 4: return &localparams;
        case 5: return design;
        case 6: return &topCells;
        case 7: return semi2;
        case 8: return &rules;
        case 9: return endconfig;
        case 10: return blockName;
        default: return nullptr;
    }
}